

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_rldinm(DisasContext_conflict10 *ctx,int mb,int me,int sh)

{
  uint len;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  TCGv_i64 arg1;
  target_ulong arg2;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  ret = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0xd & 0xf8));
  arg1 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8));
  len = (me - mb) + 1;
  if (0x3f - sh == me && (-1 < me - mb && sh != 0)) {
    tcg_gen_deposit_z_i64_ppc64(tcg_ctx,ret,arg1,sh,len);
  }
  else if ((int)((-sh & 0x3fU) + len) < 0x41 && me == 0x3f) {
    tcg_gen_extract_i64_ppc64(tcg_ctx,ret,arg1,-sh & 0x3fU,len);
  }
  else {
    tcg_gen_rotli_i64_ppc64(tcg_ctx,ret,arg1,sh);
    arg2 = MASK((ulong)(uint)mb,(long)me);
    tcg_gen_andi_i64_ppc64(tcg_ctx,ret,ret,arg2);
  }
  if ((ctx->opcode & 1) == 0) {
    return;
  }
  gen_set_Rc0(ctx,ret);
  return;
}

Assistant:

static void gen_rldinm(DisasContext *ctx, int mb, int me, int sh)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t_ra = cpu_gpr[rA(ctx->opcode)];
    TCGv t_rs = cpu_gpr[rS(ctx->opcode)];
    int len = me - mb + 1;
    int rsh = (64 - sh) & 63;

    if (sh != 0 && len > 0 && me == (63 - sh)) {
        tcg_gen_deposit_z_tl(tcg_ctx, t_ra, t_rs, sh, len);
    } else if (me == 63 && rsh + len <= 64) {
        tcg_gen_extract_tl(tcg_ctx, t_ra, t_rs, rsh, len);
    } else {
        tcg_gen_rotli_tl(tcg_ctx, t_ra, t_rs, sh);
        tcg_gen_andi_tl(tcg_ctx, t_ra, t_ra, MASK(mb, me));
    }
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, t_ra);
    }
}